

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

void __thiscall
MutableS2ShapeIndex::InteriorTracker::TestEdge(InteriorTracker *this,int32 shape_id,Edge *edge)

{
  bool bVar1;
  int iVar2;
  S2LogMessage SStack_28;
  
  if ((Edge *)(this->crosser_).c_ != edge) {
    bVar1 = S2::IsUnitLength(&edge->v0);
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                (&SStack_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                 ,0x102,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_28.stream_,"Check failed: S2::IsUnitLength(*c) ",0x23);
      abort();
    }
    (this->crosser_).c_ = &edge->v0;
    iVar2 = s2pred::TriageSign((this->crosser_).a_,(this->crosser_).b_,&edge->v0,
                               &(this->crosser_).a_cross_b_);
    (this->crosser_).acb_ = -iVar2;
  }
  bVar1 = S2EdgeCrosser::EdgeOrVertexCrossing(&this->crosser_,&edge->v1);
  if (bVar1) {
    ToggleShape(this,shape_id);
    return;
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::InteriorTracker::TestEdge(
    int32 shape_id, const S2Shape::Edge& edge) {
  if (crosser_.EdgeOrVertexCrossing(&edge.v0, &edge.v1)) {
    ToggleShape(shape_id);
  }
}